

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O0

void __thiscall
ReconnectingHub::connectionClosed(ReconnectingHub *this,Stream *stream,bool abnormal)

{
  ostream *poVar1;
  string *psVar2;
  string local_40;
  byte local_19;
  Stream *pSStack_18;
  bool abnormal_local;
  Stream *stream_local;
  ReconnectingHub *this_local;
  
  this->connected = false;
  local_19 = abnormal;
  pSStack_18 = stream;
  stream_local = (Stream *)this;
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Lost connection to ");
  Dashel::Stream::getTargetName_abi_cxx11_(&local_40,pSStack_18);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if ((local_19 & 1) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout," : ");
    psVar2 = Dashel::Stream::getFailReason_abi_cxx11_(pSStack_18);
    std::operator<<(poVar1,(string *)psVar2);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

virtual void connectionClosed(Stream* stream, bool abnormal)
	{
		connected = false;
		cout << endl
			 << "Lost connection to " << stream->getTargetName();
		if (abnormal)
			cout << " : " << stream->getFailReason();
		cout << endl;
	}